

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IndirectDispatchCase::iterate(IndirectDispatchCase *this)

{
  RenderContext *pRVar1;
  TestLog *log;
  pointer pDVar2;
  ScopedLogSection SVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  pointer pcVar10;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar11;
  undefined4 extraout_var_01;
  long *plVar12;
  undefined4 extraout_var_02;
  uint *puVar13;
  ostream *poVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar15;
  pointer pDVar16;
  TestError *pTVar17;
  size_type *psVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *description;
  undefined1 auVar21 [8];
  int *piVar22;
  ulong uVar23;
  long lVar24;
  size_type __dnew;
  Buffer resultBuffer;
  Buffer cmdBuffer;
  ostringstream s;
  ShaderProgram program_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  size_type *local_4c8;
  value_type local_4c0;
  long local_4a0;
  string local_498;
  long local_478;
  ScopedLogSection local_470;
  undefined1 local_468 [8];
  string local_460;
  StringTemplate local_440;
  undefined1 local_420 [8];
  pointer local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [6];
  ios_base local_3b0 [8];
  ios_base local_3a8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_390;
  deUint32 local_378;
  undefined1 local_370 [208];
  undefined1 local_2a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_210;
  deUint32 local_1f8;
  undefined1 local_1f0 [24];
  bool local_1d8;
  undefined1 local_1d0 [12];
  uint uStack_1c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Base_ptr local_1b0;
  pointer local_1a8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  lVar15 = CONCAT44(extraout_var,iVar7);
  local_1c0._8_8_ = local_1d0 + 8;
  stack0xfffffffffffffe38 = (pointer)((ulong)uStack_1c4 << 0x20);
  local_1c0._M_allocated_capacity = 0;
  local_1a8 = (pointer)0x0;
  local_1b0 = (_Base_ptr)local_1c0._8_8_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
  std::ostream::_M_insert<unsigned_long>((ulong)local_420);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
  std::ios_base::~ios_base(local_3b0);
  local_410[0]._M_allocated_capacity = 0x49535f4c41434f4c;
  local_410[0]._8_4_ = 0x585f455a;
  local_418 = (pointer)0xc;
  local_410[0]._M_local_buf[0xc] = '\0';
  local_420 = (undefined1  [8])local_410;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1d0,(key_type *)local_420);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_4c8);
  if (local_420 != (undefined1  [8])local_410) {
    operator_delete((void *)local_420,local_410[0]._M_allocated_capacity + 1);
  }
  psVar18 = &local_4c0._M_string_length;
  if (local_4c8 != psVar18) {
    operator_delete(local_4c8,local_4c0._M_string_length + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
  std::ostream::_M_insert<unsigned_long>((ulong)local_420);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
  std::ios_base::~ios_base(local_3b0);
  local_410[0]._M_allocated_capacity = 0x49535f4c41434f4c;
  local_410[0]._8_4_ = 0x595f455a;
  local_418 = (pointer)0xc;
  local_410[0]._M_local_buf[0xc] = '\0';
  local_420 = (undefined1  [8])local_410;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1d0,(key_type *)local_420);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_4c8);
  if (local_420 != (undefined1  [8])local_410) {
    operator_delete((void *)local_420,local_410[0]._M_allocated_capacity + 1);
  }
  if (local_4c8 != psVar18) {
    operator_delete(local_4c8,local_4c0._M_string_length + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
  std::ostream::_M_insert<unsigned_long>((ulong)local_420);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
  std::ios_base::~ios_base(local_3b0);
  local_410[0]._M_allocated_capacity = 0x49535f4c41434f4c;
  local_410[0]._8_4_ = 0x5a5f455a;
  local_418 = (pointer)0xc;
  local_410[0]._M_local_buf[0xc] = '\0';
  local_420 = (undefined1  [8])local_410;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1d0,(key_type *)local_420);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_4c8);
  if (local_420 != (undefined1  [8])local_410) {
    operator_delete((void *)local_420,local_410[0]._M_allocated_capacity + 1);
  }
  if (local_4c8 != psVar18) {
    operator_delete(local_4c8,local_4c0._M_string_length + 1);
  }
  local_370[0x10] = 0;
  local_370._17_8_ = 0;
  local_370._0_8_ = (pointer)0x0;
  local_370[8] = 0;
  local_370._9_7_ = 0;
  memset(local_420,0,0xac);
  local_470.m_log = (TestLog *)0x177;
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar10 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)&local_470);
  SVar3.m_log = local_470.m_log;
  local_460.field_2._M_allocated_capacity = (size_type)local_470.m_log;
  local_460._M_dataplus._M_p = pcVar10;
  memcpy(pcVar10,
         "#version 310 es\nlayout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\nlayout(binding = 0, std430) buffer Result\n{\n    uvec3           expectedGroupCount;\n    coherent uint   numPassed;\n} result;\nvoid main (void)\n{\n    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n        atomicAdd(result.numPassed, 1u);\n}\n"
         ,0x177);
  local_460._M_string_length = (size_type)SVar3.m_log;
  pcVar10[(long)SVar3.m_log] = '\0';
  tcu::StringTemplate::StringTemplate(&local_440,&local_460);
  tcu::StringTemplate::specialize
            (&local_498,&local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1d0);
  local_4c8 = (size_type *)CONCAT44(local_4c8._4_4_,5);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,local_498._M_dataplus._M_p,
             local_498._M_dataplus._M_p + local_498._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_420 + ((ulong)local_4c8 & 0xffffffff) * 0x18),&local_4c0);
  lVar24 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_2a0 + lVar24),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_420 + lVar24));
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_210,&local_390);
  local_1f8 = local_378;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1f0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_370);
  local_1d8 = (bool)local_370[0x18];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,(ulong)(local_460.field_2._M_allocated_capacity + 1))
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_370);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_390);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_420 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1d0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_210);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  iVar7 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_440,(Functions *)CONCAT44(extraout_var_00,iVar7),pOVar11);
  iVar7 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_460,(Functions *)CONCAT44(extraout_var_01,iVar7),pOVar11);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_100
                 );
  if (local_100.m_program.m_info.linkOk != false) {
    local_420 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_418,"GL_DISPATCH_INDIRECT_BUFFER size = ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_420,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
    std::ios_base::~ios_base(local_3a8);
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2a0._0_8_ = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Commands","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
    std::ostream::_M_insert<unsigned_long>((ulong)local_420);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
    std::ios_base::~ios_base(local_3b0);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,0x99a01d);
    psVar18 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar18) {
      local_4c0._M_string_length = *psVar18;
      local_4c0.field_2._M_allocated_capacity = plVar12[3];
      local_4c8 = &local_4c0._M_string_length;
    }
    else {
      local_4c0._M_string_length = *psVar18;
      local_4c8 = (size_type *)*plVar12;
    }
    local_4c0._M_dataplus._M_p = (pointer)plVar12[1];
    *plVar12 = (long)psVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_4c8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar20) {
      local_1c0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_1c0._8_8_ = plVar12[3];
      local_1d0._0_8_ = &local_1c0;
    }
    else {
      local_1c0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_1d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar12;
    }
    unique0x00012000 = (pointer)plVar12[1];
    *plVar12 = (long)paVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&local_470,log,(string *)local_2a0,(string *)local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
    }
    if (local_4c8 != &local_4c0._M_string_length) {
      operator_delete(local_4c8,local_4c0._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_ !=
        local_290) {
      operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_dataplus._M_p + 1));
    }
    if ((this->m_commands).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_commands).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar24 = 8;
      uVar23 = 0;
      do {
        local_420 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"offset = ",9);
        std::ostream::_M_insert<long>((long)&local_418);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_418,", numWorkGroups = ",0x12);
        tcu::operator<<((ostream *)&local_418,
                        (Vector<unsigned_int,_3> *)
                        ((long)(((this->m_commands).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->numWorkGroups).m_data +
                        lVar24 + -8));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_420,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
        std::ios_base::~ios_base(local_3a8);
        uVar23 = uVar23 + 1;
        lVar24 = lVar24 + 0x18;
      } while (uVar23 < (ulong)(((long)(this->m_commands).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_commands).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    tcu::TestLog::endSection(local_470.m_log);
    uVar4 = local_460.field_2._M_allocated_capacity;
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar24 = CONCAT44(extraout_var_02,iVar7);
    local_420 = (undefined1  [8])((ulong)local_420 & 0xffffffff00000000);
    (**(code **)(lVar24 + 0x868))(0x90df);
    iVar7 = 0x10;
    if ((local_420._0_4_ != 0) && ((int)(0x10 % (long)(int)local_420._0_4_) != 0)) {
      iVar7 = ((int)(0x10 / (long)(int)local_420._0_4_) + 1) * local_420._0_4_;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_420,
               (long)((int)((ulong)((long)(this->m_commands).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_commands).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * iVar7 *
                     -0x55555555),(allocator_type *)local_2a0);
    pDVar16 = (this->m_commands).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = (long)(this->m_commands).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar16;
    if (lVar19 != 0) {
      lVar19 = (lVar19 >> 3) * -0x5555555555555555;
      lVar19 = lVar19 + (ulong)(lVar19 == 0);
      puVar13 = (pDVar16->numWorkGroups).m_data + 2;
      pcVar10 = (pointer)((long)local_420 + 0xc);
      do {
        *(uint *)(pcVar10 + -0xc) = ((UVec3 *)(puVar13 + -2))->m_data[0];
        *(uint *)(pcVar10 + -8) = puVar13[-1];
        *(uint *)(pcVar10 + -4) = *puVar13;
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        puVar13 = puVar13 + 6;
        pcVar10 = pcVar10 + iVar7;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    (**(code **)(lVar24 + 0x40))(0x90d2,uVar4 & 0xffffffff);
    (**(code **)(lVar24 + 0x150))(0x90d2,(long)((int)local_418 - local_420._0_4_),local_420,0x88e5);
    if (local_420 != (undefined1  [8])0x0) {
      operator_delete((void *)local_420,local_410[0]._M_allocated_capacity - (long)local_420);
    }
    uVar5 = local_440.m_template.field_2._M_allocated_capacity._0_4_;
    if (this->m_genBuffer == GEN_BUFFER_UPLOAD) {
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_420,
                 this->m_bufferSize,(allocator_type *)local_2a0);
      pDVar2 = (this->m_commands).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar16 = (this->m_commands).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar16 != pDVar2;
          pDVar16 = pDVar16 + 1) {
        lVar24 = pDVar16->offset;
        *(uint *)((long)local_420 + lVar24) = (pDVar16->numWorkGroups).m_data[0];
        *(uint *)((long)local_420 + lVar24 + 4) = (pDVar16->numWorkGroups).m_data[1];
        *(uint *)((long)local_420 + lVar24 + 8) = (pDVar16->numWorkGroups).m_data[2];
      }
      (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x40))(0x90ee,uVar5);
      (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x150))
                (0x90ee,(long)local_418 - (long)local_420,local_420,0x88e4);
      if (local_420 != (undefined1  [8])0x0) {
        operator_delete((void *)local_420,local_410[0]._M_allocated_capacity - (long)local_420);
      }
    }
    else if (this->m_genBuffer == GEN_BUFFER_COMPUTE) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
      local_468._0_4_ = uVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_420,
                 "#version 310 es\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 1) buffer Out\n{\n\thighp uint data[];\n};\nvoid writeCmd (uint offset, uvec3 numWorkGroups)\n{\n\tdata[offset+0u] = numWorkGroups.x;\n\tdata[offset+1u] = numWorkGroups.y;\n\tdata[offset+2u] = numWorkGroups.z;\n}\nvoid main (void)\n{\n"
                 ,0x121);
      pDVar16 = (this->m_commands).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pDVar16 !=
          (this->m_commands).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_420,"\twriteCmd(",10);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_420);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"u, uvec3(",9);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"u, ",3);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"u, ",3);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"u));\n",5);
          pDVar16 = pDVar16 + 1;
        } while (pDVar16 !=
                 (this->m_commands).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_420,"}\n",2);
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      auVar21 = local_468;
      lVar24 = CONCAT44(extraout_var_03,iVar7);
      pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
      local_120[0x10] = 0;
      local_120._17_8_ = 0;
      local_120._0_8_ = (pointer)0x0;
      local_120[8] = 0;
      local_120._9_7_ = 0;
      memset(local_1d0,0,0xac);
      std::__cxx11::stringbuf::str();
      local_4c8 = (size_type *)CONCAT44(local_4c8._4_4_,5);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4c0,local_498._M_dataplus._M_p,
                 local_498._M_dataplus._M_p + local_498._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1d0 + ((ulong)local_4c8 & 0xffffffff) * 0x18),&local_4c0);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_2a0,pRVar1,(ProgramSources *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_120);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_140);
      lVar19 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1d0 + lVar19));
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != -0x18);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      (ShaderProgram *)local_2a0);
      if (local_1f0[0x10] == false) {
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"Compile failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                   ,0xf6);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar24 + 0x1680))
                ((deUint32)
                 local_210.
                 super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      (**(code **)(lVar24 + 0x40))(0x90ee,(ulong)auVar21 & 0xffffffff);
      (**(code **)(lVar24 + 0x150))(0x90ee,this->m_bufferSize,0,0x88e4);
      (**(code **)(lVar24 + 0x48))(0x90d2,1,(ulong)auVar21 & 0xffffffff);
      dVar8 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar8,"Buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0xfd);
      (**(code **)(lVar24 + 0x528))(1,1,1);
      dVar8 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar8,"glDispatchCompute() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0x100);
      (**(code **)(lVar24 + 0xdb8))(0x40);
      dVar8 = (**(code **)(lVar24 + 0x800))();
      glu::checkError(dVar8,"glMemoryBarrier(GL_COMMAND_BARRIER_BIT) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0x103);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      std::ios_base::~ios_base(local_3b0);
    }
    (**(code **)(lVar15 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar15 + 0x40))(0x90ee,local_440.m_template.field_2._M_allocated_capacity._0_4_);
    dVar8 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar8,"State setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x16f);
    local_420 = (undefined1  [8])((ulong)local_420 & 0xffffffff00000000);
    (**(code **)(lVar15 + 0x868))(0x90df);
    lVar24 = 0x10;
    if ((local_420._0_4_ != 0) && ((int)(0x10 % (long)(int)local_420._0_4_) != 0)) {
      lVar24 = (long)(((int)(0x10 / (long)(int)local_420._0_4_) + 1) * local_420._0_4_);
    }
    pDVar16 = (this->m_commands).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar16 !=
        (this->m_commands).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar19 = 0;
      do {
        (**(code **)(lVar15 + 0x50))
                  (0x90d2,0,local_460.field_2._M_allocated_capacity & 0xffffffff,lVar19,lVar24);
        (**(code **)(lVar15 + 0x530))(pDVar16->offset);
        lVar19 = lVar19 + lVar24;
        pDVar16 = pDVar16 + 1;
      } while (pDVar16 !=
               (this->m_commands).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    dVar8 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar8,"glDispatchComputeIndirect() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x17e);
    uVar4 = local_460.field_2._M_allocated_capacity;
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_4a0 = CONCAT44(extraout_var_05,iVar7);
    local_420 = (undefined1  [8])((ulong)local_420 & 0xffffffff00000000);
    (**(code **)(local_4a0 + 0x868))(0x90df);
    iVar7 = 0x10;
    if ((local_420._0_4_ != 0) && ((int)(0x10 % (long)(int)local_420._0_4_) != 0)) {
      iVar7 = ((int)(0x10 / (long)(int)local_420._0_4_) + 1) * local_420._0_4_;
    }
    pDVar16 = (this->m_commands).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->m_commands).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (**(code **)(local_4a0 + 0x40))(0x90d2,uVar4 & 0xffffffff);
    lVar15 = (**(code **)(local_4a0 + 0xd00))
                       (0x90d2,0,(long)((int)((ulong)((long)pDVar2 - (long)pDVar16) >> 3) * iVar7 *
                                       -0x55555555),1);
    dVar8 = (**(code **)(local_4a0 + 0x800))();
    glu::checkError(dVar8,"glMapBufferRange() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x133);
    if (lVar15 != 0) {
      pDVar16 = (this->m_commands).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_commands).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_finish == pDVar16) {
        bVar6 = true;
      }
      else {
        piVar22 = (int *)(lVar15 + 0xc);
        auVar21 = (undefined1  [8])(long)iVar7;
        bVar6 = true;
        lVar24 = 0x10;
        uVar23 = 0;
        local_478 = lVar15;
        local_468 = auVar21;
        do {
          if (*piVar22 !=
              (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
              (this->m_workGroupSize).m_data[2] *
              *(int *)((long)(pDVar16->numWorkGroups).m_data + lVar24 + -0x10) *
              *(int *)((long)(&pDVar16->numWorkGroups + -1) + lVar24) *
              *(int *)((long)(pDVar16->numWorkGroups).m_data + lVar24 + -8)) {
            local_420 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_418,"ERROR: got invalid result for invocation ",0x29);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_418,": got numPassed = ",0x12);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_418,", expected ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_420,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
            std::ios_base::~ios_base(local_3a8);
            bVar6 = false;
            auVar21 = local_468;
          }
          uVar23 = uVar23 + 1;
          pDVar16 = (this->m_commands).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = lVar24 + 0x18;
          piVar22 = (int *)((long)piVar22 + (long)auVar21);
        } while (uVar23 < (ulong)(((long)(this->m_commands).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar16
                                  >> 3) * -0x5555555555555555));
      }
      (**(code **)(local_4a0 + 0x1670))(0x90d2);
      dVar8 = (**(code **)(local_4a0 + 0x800))();
      glu::checkError(dVar8,"glUnmapBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                      ,0x14e);
      description = "Invalid values in result buffer";
      if (bVar6) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar6,
                 description);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_460);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_440);
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return STOP;
    }
    local_478 = lVar15;
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,(char *)0x0,"mapPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
               ,0x134);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar17,"Compile failed","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
             ,0x15e);
  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IndirectDispatchCase::IterateResult IndirectDispatchCase::iterate (void)
{
	const glu::RenderContext&		renderCtx			= m_context.getRenderContext();
	const glw::Functions&			gl					= renderCtx.getFunctions();

	const glu::ShaderProgram		program				(renderCtx, genVerifySources(m_workGroupSize));

	glu::Buffer						cmdBuffer			(renderCtx);
	glu::Buffer						resultBuffer		(renderCtx);

	m_testCtx.getLog() << program;
	TCU_CHECK_MSG(program.isOk(), "Compile failed");

	m_testCtx.getLog() << TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(m_testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_commands.size()) + " in total)");

		for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
			m_testCtx.getLog() << TestLog::Message << cmdNdx << ": " << "offset = " << m_commands[cmdNdx].offset
												   << ", numWorkGroups = " << m_commands[cmdNdx].numWorkGroups
							   << TestLog::EndMessage;
	}

	createResultBuffer(*resultBuffer);
	createCommandBuffer(*cmdBuffer);

	gl.useProgram(program.getProgram());
	gl.bindBuffer(GL_DISPATCH_INDIRECT_BUFFER, *cmdBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "State setup failed");

	{
		const int	resultBlockAlignedSize		= getResultBlockAlignedSize(gl);
		deIntptr	curOffset					= 0;

		for (vector<DispatchCommand>::const_iterator cmdIter = m_commands.begin(); cmdIter != m_commands.end(); ++cmdIter)
		{
			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, *resultBuffer, (glw::GLintptr)curOffset, resultBlockAlignedSize);
			gl.dispatchComputeIndirect((glw::GLintptr)cmdIter->offset);

			curOffset += resultBlockAlignedSize;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchComputeIndirect() failed");

	if (verifyResultBuffer(*resultBuffer))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");

	return STOP;
}